

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

bool mjs::operator==(token *l,token *r)

{
  token_type tVar1;
  token_type tVar2;
  size_t __n;
  int iVar3;
  
  tVar1 = l->type_;
  tVar2 = r->type_;
  if (tVar1 == tVar2) {
    if (tVar1 != string_literal) {
      if (tVar1 == numeric_literal) {
        if (tVar2 == numeric_literal) {
          return (bool)(-((r->field_1).dvalue_ == (l->field_1).dvalue_) & 1);
        }
        __assert_fail("type_ == token_type::numeric_literal",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h"
                      ,0xdb,"double mjs::token::dvalue() const");
      }
      if (tVar1 != identifier) {
        return true;
      }
    }
    if ((tVar2 != identifier) && (tVar2 != string_literal)) {
      __assert_fail("has_text()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h",
                    0xd6,"const std::wstring &mjs::token::text() const");
    }
    __n = (l->field_1).text_._M_string_length;
    if (__n == (r->field_1).text_._M_string_length) {
      if (__n == 0) {
        return true;
      }
      iVar3 = wmemcmp((wchar_t *)(l->field_1).ivalue_,(wchar_t *)(r->field_1).ivalue_,__n);
      return iVar3 == 0;
    }
  }
  return false;
}

Assistant:

bool operator==(const token& l, const token& r) {
    if (l.type() != r.type()) {
        return false;
    } else if (l.has_text()) {
        return l.text() == r.text();
    } else if (l.type() == token_type::numeric_literal) {
        return l.dvalue() == r.dvalue();
    }
    return true;
}